

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O0

nodeit * __thiscall N::operator[](N *this,nodeit ps_)

{
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> next_it;
  bool bVar1;
  uint uVar2;
  N *pNVar3;
  N *pNVar4;
  undefined8 in_RSI;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *in_RDI;
  N *p;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __end1;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> __begin1;
  nodeit *__range1;
  nodeit *last;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_fffffffffffffed8;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_fffffffffffffee0;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *this_00;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *this_01;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_ffffffffffffff30;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_ffffffffffffff38;
  N *in_stack_ffffffffffffff48;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> in_stack_ffffffffffffff50;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_88;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_68;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *local_48;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *local_40;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> local_38;
  N **local_18;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> local_10;
  
  this_01 = (CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N> *)
            &stack0x00000008;
  this_00 = in_RDI;
  uVar2 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::size
                    (in_RDI);
  if (uVar2 == 0) {
    local_10._M_current =
         (N **)std::vector<N_*,_std::allocator<N_*>_>::end
                         ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffed8);
    local_18 = (N **)std::vector<N_*,_std::allocator<N_*>_>::end
                               ((vector<N_*,_std::allocator<N_*>_> *)in_stack_fffffffffffffed8);
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::CIt
              (this_00,local_10,
               (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>)local_18);
  }
  else {
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
              (&local_38,this_01);
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::operator*
              ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                *)0x18cff7);
    operator[]((N *)in_stack_ffffffffffffff50._M_current,in_stack_ffffffffffffff48);
    local_48 = this_01;
    local_40 = this_00;
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
              (&local_68,this_01);
    CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::end
              (&local_88,local_48);
    while (bVar1 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                   ::operator!=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8), bVar1) {
      pNVar3 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
               operator*((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                          *)0x18d078);
      CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::begin
                ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  *)&stack0xffffffffffffff50,this_01);
      pNVar4 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
               operator*((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                          *)0x18d0a6);
      if (pNVar3 != pNVar4) {
        in_stack_fffffffffffffed8 = in_stack_ffffffffffffff30;
        in_stack_fffffffffffffee0 = in_stack_ffffffffffffff38;
        operator[]((N *)in_stack_ffffffffffffff50._M_current,in_stack_ffffffffffffff48);
        next_it._end._M_current = (N **)in_RSI;
        next_it._start._M_current = (N **)this_01;
        next_it._curr._M_current = (N **)in_stack_fffffffffffffed8;
        next_it.next = in_stack_fffffffffffffee0;
        in_stack_ffffffffffffff30 = in_stack_fffffffffffffed8;
        in_stack_ffffffffffffff38 = in_stack_fffffffffffffee0;
        local_40 = CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                   ::chain(this_00,next_it);
      }
      CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::
      operator++(in_stack_fffffffffffffee0);
    }
  }
  return in_RDI;
}

Assistant:

nodeit N::operator[](nodeit ps_) {
    if (ps_.size() == 0) return nodeit(os.end(), os.end());

    auto start_it = (*this)[*ps_.begin()];

    auto last = &start_it;
    for (auto p : ps_)
        if (p != *ps_.begin())
            last = last->chain((*this)[p]);

    return start_it;
}